

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O1

void __thiscall nn::ESoinn::SealNeuronVector(ESoinn *this)

{
  pointer *ppEVar1;
  long lVar2;
  ConcreteLogger *this_00;
  pointer pEVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t number_new;
  uint32_t number_old;
  bool bVar6;
  runtime_error anon_var_0;
  undefined1 auStack_58 [8];
  vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> newNeurons;
  
  this_00 = log_netw;
  ppEVar1 = &newNeurons.
             super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
             .super__Vector_impl_data._M_finish;
  auStack_58 = (undefined1  [8])ppEVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_58,"SealNeuronVector function","");
  logger::ConcreteLogger::debug(this_00,(string *)auStack_58,false);
  if (auStack_58 != (undefined1  [8])ppEVar1) {
    operator_delete((void *)auStack_58);
  }
  auStack_58 = (undefined1  [8])0x0;
  newNeurons.super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  newNeurons.super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar3 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_Neurons).
      super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar3) {
    uVar4 = 0;
    number_new = 0;
    do {
      number_old = (uint32_t)uVar4;
      if (pEVar3[uVar4].m_IsDeleted == false) {
        if ((number_old != number_new) &&
           (pEVar3 = (this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_finish != pEVar3)) {
          uVar4 = 0;
          uVar5 = 1;
          do {
            if (pEVar3[uVar4].m_IsDeleted == false) {
              neuron::ESoinnNeuron::replaceNeighbour(pEVar3 + uVar4,number_old,number_new,true);
            }
            pEVar3 = (this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = ((long)(this->m_Neurons).
                           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 3) *
                    -0xf0f0f0f0f0f0f0f;
            bVar6 = uVar5 <= uVar4;
            lVar2 = uVar4 - uVar5;
            uVar4 = uVar5;
            uVar5 = (ulong)((int)uVar5 + 1);
          } while (bVar6 && lVar2 != 0);
        }
        number_new = number_new + 1;
      }
      uVar4 = (ulong)(number_old + 1);
      pEVar3 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 3) *
              -0xf0f0f0f0f0f0f0f;
    } while (uVar4 <= uVar5 && uVar5 - uVar4 != 0);
  }
  pEVar3 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_Neurons).
      super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      if (pEVar3[uVar4].m_IsDeleted == false) {
        std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::push_back
                  ((vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *)auStack_58
                   ,pEVar3 + uVar4);
      }
      pEVar3 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 3) *
              -0xf0f0f0f0f0f0f0f;
      bVar6 = uVar5 <= uVar4;
      lVar2 = uVar4 - uVar5;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6 && lVar2 != 0);
  }
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator=
            (&this->m_Neurons,
             (vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *)auStack_58);
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::~vector
            ((vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *)auStack_58);
  return;
}

Assistant:

void ESoinn::SealNeuronVector()
    {
        log_netw->debug("SealNeuronVector function");
        std::vector<neuron::ESoinnNeuron> newNeurons;
        uint32_t count_notnull = 0;
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            if (i == count_notnull)
            {
                count_notnull++;
                continue;
            }
            //newNeurons.push_back(m_Neurons[i]);
            for (uint32_t j = 0; j < m_Neurons.size(); j++)
            {
                if (m_Neurons[j].is_deleted())
                    continue;
                try
                {
                    m_Neurons[j].replaceNeighbour(i, count_notnull, true);    
                }
                catch (std::runtime_error)
                {
                }
            }
            count_notnull++;    
        }
        
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            newNeurons.push_back(m_Neurons[i]);
        }
        m_Neurons = newNeurons;        
    }